

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O1

void __thiscall
libcellml::Validator::ValidatorImpl::validateEquivalenceUnits
          (ValidatorImpl *this,ModelPtr *model,VariablePtr *variable,VariableMap *alreadyReported)

{
  shared_ptr<libcellml::VariablePair> *psVar1;
  bool bVar2;
  size_t sVar3;
  long *plVar4;
  long *plVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  ulong *puVar8;
  element_type *peVar9;
  __normal_iterator<std::shared_ptr<libcellml::VariablePair>_*,_std::vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>_>
  __it;
  long lVar10;
  _func_int **pp_Var11;
  ulong uVar12;
  undefined8 uVar13;
  __normal_iterator<std::shared_ptr<libcellml::VariablePair>_*,_std::vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>_>
  __it_00;
  ulong uVar14;
  VariablePtr equivalentVariable;
  IssuePtr err;
  ComponentPtr equivalentComponent;
  string hints;
  double multiplier;
  ComponentPtr parentComponent;
  VariablePairPtr pair;
  undefined1 local_368 [32];
  element_type *local_348;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_340;
  element_type local_338;
  undefined1 local_318 [24];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_300;
  element_type *local_2f8;
  long local_2f0;
  element_type local_2e8;
  element_type local_2c8;
  element_type local_2a8;
  element_type local_288;
  element_type local_268;
  long local_248;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_240;
  ulong *local_230;
  long local_228;
  ulong local_220;
  long lStack_218;
  ulong *local_210;
  long local_208;
  ulong local_200;
  long lStack_1f8;
  ulong *local_1f0;
  long local_1e8;
  ulong local_1e0;
  long lStack_1d8;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  IssuePtr local_130;
  ParentedEntityConstPtr local_120;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  element_type *local_f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  element_type *local_e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  string local_d0;
  IssueImpl *local_b0;
  ValidatorImpl *local_a8;
  ModelPtr *local_a0;
  NamedEntity *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  NamedEntity *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  double local_78;
  ParentedEntityConstPtr local_70;
  string local_60;
  value_type local_40;
  
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  local_368._0_8_ =
       (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_368._8_8_ =
       (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_)->_M_use_count + 1;
    }
  }
  local_268.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
  super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)alreadyReported;
  local_a8 = this;
  local_a0 = model;
  owningComponent(&local_70);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_);
  }
  Variable::units((variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr);
  uVar13 = local_368._0_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_);
  }
  if ((element_type *)uVar13 != (element_type *)0x0) {
    uVar14 = 0;
    while( true ) {
      sVar3 = Variable::equivalentVariableCount
                        ((variable->
                         super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                        );
      if (sVar3 <= uVar14) break;
      Variable::equivalentVariable
                ((Variable *)(local_318 + 0x10),
                 (size_t)(variable->
                         super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                );
      local_368._0_8_ = local_318._16_8_;
      local_368._8_8_ = local_300._M_pi;
      if (local_300._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_300._M_pi)->_M_use_count = (local_300._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_300._M_pi)->_M_use_count = (local_300._M_pi)->_M_use_count + 1;
        }
      }
      owningComponent(&local_120);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_);
      }
      if ((local_120.super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr != (element_type *)0x0) &&
         (bVar2 = ImportedEntity::isImport
                            ((ImportedEntity *)
                             (local_120.
                              super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr + 1)), !bVar2)) {
        Variable::units((Variable *)local_318._16_8_);
        uVar13 = local_368._0_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_);
        }
        if ((element_type *)uVar13 != (element_type *)0x0) {
          local_78 = 0.0;
          bVar2 = unitsAreEquivalent(local_a0,variable,(VariablePtr *)(local_318 + 0x10),&local_d0,
                                     &local_78);
          if (!bVar2) {
            __it_00._M_current =
                 (((_Vector_base<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>
                    *)&(local_268.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                        super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       super_NamedEntity)->_M_impl).super__Vector_impl_data._M_start;
            psVar1 = (((_Vector_base<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>
                        *)&(local_268.super_enable_shared_from_this<libcellml::Variable>.
                            _M_weak_this.
                            super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           )->super_NamedEntity)->_M_impl).super__Vector_impl_data._M_finish;
            local_f0 = (element_type *)local_318._16_8_;
            local_e8 = local_300._M_pi;
            if (local_300._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_300._M_pi)->_M_use_count = (local_300._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_300._M_pi)->_M_use_count = (local_300._M_pi)->_M_use_count + 1;
              }
            }
            local_338.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
                 (_func_int **)
                 (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
            local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl =
                 (EntityImpl *)
                 (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl)->_M_use_count
                     = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl)->
                       _M_use_count + 1;
                UNLOCK();
              }
              else {
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl)->_M_use_count
                     = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl)->
                       _M_use_count + 1;
              }
            }
            if (local_300._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_300._M_pi)->_M_use_count = (local_300._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_300._M_pi)->_M_use_count = (local_300._M_pi)->_M_use_count + 1;
              }
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl)->_M_use_count
                     = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl)->
                       _M_use_count + 1;
                UNLOCK();
              }
              else {
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl)->_M_use_count
                     = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl)->
                       _M_use_count + 1;
              }
            }
            local_348 = (element_type *)0x0;
            p_Stack_340 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl)->_M_use_count
                     = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl)->
                       _M_use_count + 1;
                UNLOCK();
              }
              else {
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl)->_M_use_count
                     = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl)->
                       _M_use_count + 1;
              }
              if (__libc_single_threaded == '\0') {
                LOCK();
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl)->_M_use_count
                     = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl)->
                       _M_use_count + 1;
                UNLOCK();
              }
              else {
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl)->_M_use_count
                     = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl)->
                       _M_use_count + 1;
              }
            }
            local_338.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
            super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 local_300._M_pi;
            local_338.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
            super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_318._16_8_;
            local_318._0_8_ =
                 local_338.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity;
            local_318._8_8_ = local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl;
            local_e0 = (element_type *)
                       local_338.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity;
            local_d8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
            }
            local_368._0_8_ =
                 local_338.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                 super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_368._8_8_ =
                 local_338.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                 super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            ;
            if (local_338.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_338.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                 super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                )->_M_use_count =
                     (local_338.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                      super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_338.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                 super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                )->_M_use_count =
                     (local_338.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                      super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
              }
            }
            local_368._16_8_ = local_318._0_8_;
            local_368._24_8_ = local_318._8_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_318._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_318._8_8_ + 8) = *(_Atomic_word *)(local_318._8_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_318._8_8_ + 8) = *(_Atomic_word *)(local_318._8_8_ + 8) + 1;
              }
            }
            lVar10 = (long)psVar1 - (long)__it_00._M_current >> 6;
            if (0 < lVar10) {
              lVar10 = lVar10 + 1;
              do {
                bVar2 = __gnu_cxx::__ops::
                        _Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                        ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                      *)local_368,__it_00);
                __it._M_current = __it_00._M_current;
                if (bVar2) goto LAB_00285e5a;
                bVar2 = __gnu_cxx::__ops::
                        _Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                        ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                      *)local_368,__it_00._M_current + 1);
                __it._M_current = __it_00._M_current + 1;
                if (bVar2) goto LAB_00285e5a;
                bVar2 = __gnu_cxx::__ops::
                        _Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                        ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                      *)local_368,__it_00._M_current + 2);
                __it._M_current = __it_00._M_current + 2;
                if (bVar2) goto LAB_00285e5a;
                bVar2 = __gnu_cxx::__ops::
                        _Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                        ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                      *)local_368,__it_00._M_current + 3);
                __it._M_current = __it_00._M_current + 3;
                if (bVar2) goto LAB_00285e5a;
                __it_00._M_current = __it_00._M_current + 4;
                lVar10 = lVar10 + -1;
              } while (1 < lVar10);
            }
            lVar10 = (long)psVar1 - (long)__it_00._M_current >> 4;
            if (lVar10 == 1) {
LAB_00285e46:
              bVar2 = __gnu_cxx::__ops::
                      _Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                      ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                    *)local_368,__it_00);
              __it._M_current = psVar1;
              if (bVar2) {
                __it._M_current = __it_00._M_current;
              }
            }
            else {
              __it._M_current = __it_00._M_current;
              if (lVar10 == 2) {
LAB_00285e17:
                bVar2 = __gnu_cxx::__ops::
                        _Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                        ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                      *)local_368,__it);
                if (!bVar2) {
                  __it_00._M_current = __it._M_current + 1;
                  goto LAB_00285e46;
                }
              }
              else {
                __it._M_current = psVar1;
                if ((lVar10 == 3) &&
                   (bVar2 = __gnu_cxx::__ops::
                            _Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                            ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                          *)local_368,__it_00), __it._M_current = __it_00._M_current
                   , !bVar2)) {
                  __it._M_current = __it_00._M_current + 1;
                  goto LAB_00285e17;
                }
              }
            }
LAB_00285e5a:
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._24_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._24_8_);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._8_8_);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_318._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_318._8_8_);
            }
            if (local_338.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_338.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                         super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
            }
            if (p_Stack_340 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_340);
            }
            if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
            }
            if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
            }
            if (__it._M_current ==
                (((_Vector_base<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>
                   *)&(local_268.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                       super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      super_NamedEntity)->_M_impl).super__Vector_impl_data._M_finish) {
              VariablePair::create
                        ((VariablePair *)&local_40,variable,(VariablePtr *)(local_318 + 0x10));
              std::
              vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>
              ::push_back((vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>
                           *)local_268.super_enable_shared_from_this<libcellml::Variable>.
                             _M_weak_this.
                             super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr,&local_40);
              Issue::IssueImpl::create();
              local_b0 = (local_130.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->mPimpl;
              NamedEntity::name_abi_cxx11_
                        (&local_60,
                         &((variable->
                           super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->super_NamedEntity);
              plVar4 = (long *)std::__cxx11::string::replace
                                         ((ulong)&local_60,0,(char *)0x0,0x29da21);
              plVar5 = plVar4 + 2;
              if ((long *)*plVar4 == plVar5) {
                local_100 = *plVar5;
                lStack_f8 = plVar4[3];
                local_110 = &local_100;
              }
              else {
                local_100 = *plVar5;
                local_110 = (long *)*plVar4;
              }
              local_108 = plVar4[1];
              *plVar4 = (long)plVar5;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              plVar4 = (long *)std::__cxx11::string::append((char *)&local_110);
              peVar6 = (element_type *)(plVar4 + 2);
              if ((element_type *)*plVar4 == peVar6) {
                local_2e8.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
                     (peVar6->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
                local_2e8.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl =
                     (EntityImpl *)plVar4[3];
                local_2f8 = &local_2e8;
              }
              else {
                local_2e8.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
                     (peVar6->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
                local_2f8 = (element_type *)*plVar4;
              }
              local_2f0 = plVar4[1];
              *plVar4 = (long)peVar6;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              NamedEntity::name_abi_cxx11_
                        (&local_150,
                         (NamedEntity *)
                         local_70.
                         super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
              pp_Var11 = (_func_int **)0xf;
              if (local_2f8 != &local_2e8) {
                pp_Var11 = local_2e8.super_NamedEntity.super_ParentedEntity.super_Entity.
                           _vptr_Entity;
              }
              if (pp_Var11 < (_func_int **)(local_2f0 + local_150._M_string_length)) {
                uVar13 = (_func_int **)0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_150._M_dataplus._M_p != &local_150.field_2) {
                  uVar13 = local_150.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar13 < (_func_int **)(local_2f0 + local_150._M_string_length))
                goto LAB_0028607e;
                plVar4 = (long *)std::__cxx11::string::replace
                                           ((ulong)&local_150,0,(char *)0x0,(ulong)local_2f8);
              }
              else {
LAB_0028607e:
                plVar4 = (long *)std::__cxx11::string::_M_append
                                           ((char *)&local_2f8,(ulong)local_150._M_dataplus._M_p);
              }
              local_2e8.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
              super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_2c8;
              peVar6 = (element_type *)(plVar4 + 2);
              if ((element_type *)*plVar4 == peVar6) {
                local_2c8.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
                     (peVar6->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
                local_2c8.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl =
                     (EntityImpl *)plVar4[3];
              }
              else {
                local_2c8.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
                     (peVar6->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
                local_2e8.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)*plVar4;
              }
              local_2e8.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
              super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar4[1];
              *plVar4 = (long)peVar6;
              plVar4[1] = 0;
              *(undefined1 *)
               &(peVar6->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity = 0;
              plVar4 = (long *)std::__cxx11::string::append
                                         ((char *)&local_2e8.
                                                                                                      
                                                  super_enable_shared_from_this<libcellml::Variable>
                                         );
              local_268.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
              super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   &local_240;
              p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar4 + 2);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar4 == p_Var7) {
                local_240._vptr__Sp_counted_base = p_Var7->_vptr__Sp_counted_base;
                local_240._8_8_ = plVar4[3];
              }
              else {
                local_240._vptr__Sp_counted_base = p_Var7->_vptr__Sp_counted_base;
                local_268.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                     = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar4;
              }
              local_248 = plVar4[1];
              *plVar4 = (long)p_Var7;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              Variable::units((variable->
                              super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr);
              NamedEntity::name_abi_cxx11_(&local_170,local_88);
              pp_Var11 = (_func_int **)0xf;
              if (local_268.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                  super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi != &local_240) {
                pp_Var11 = local_240._vptr__Sp_counted_base;
              }
              if (pp_Var11 < (_func_int **)(local_170._M_string_length + local_248)) {
                uVar13 = (_func_int **)0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170._M_dataplus._M_p != &local_170.field_2) {
                  uVar13 = local_170.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar13 < (_func_int **)(local_170._M_string_length + local_248))
                goto LAB_002861e7;
                plVar4 = (long *)std::__cxx11::string::replace
                                           ((ulong)&local_170,0,(char *)0x0,
                                            (ulong)local_268.
                                                                                                      
                                                  super_enable_shared_from_this<libcellml::Variable>
                                                  ._M_weak_this.
                                                  super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
              }
              else {
LAB_002861e7:
                plVar4 = (long *)std::__cxx11::string::_M_append
                                           ((char *)&local_268.
                                                                                                          
                                                  super_enable_shared_from_this<libcellml::Variable>
                                                  ._M_weak_this.
                                                  super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount,(ulong)local_170._M_dataplus._M_p);
              }
              local_2c8.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
              super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_2a8;
              peVar6 = (element_type *)(plVar4 + 2);
              if ((element_type *)*plVar4 == peVar6) {
                local_2a8.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
                     (peVar6->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
                local_2a8.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl =
                     (EntityImpl *)plVar4[3];
              }
              else {
                local_2a8.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
                     (peVar6->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
                local_2c8.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)*plVar4;
              }
              local_2c8.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
              super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar4[1];
              *plVar4 = (long)peVar6;
              plVar4[1] = 0;
              *(undefined1 *)
               &(peVar6->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity = 0;
              plVar4 = (long *)std::__cxx11::string::append
                                         ((char *)&local_2c8.
                                                                                                      
                                                  super_enable_shared_from_this<libcellml::Variable>
                                         );
              local_230 = &local_220;
              puVar8 = (ulong *)(plVar4 + 2);
              if ((ulong *)*plVar4 == puVar8) {
                local_220 = *puVar8;
                lStack_218 = plVar4[3];
              }
              else {
                local_220 = *puVar8;
                local_230 = (ulong *)*plVar4;
              }
              local_228 = plVar4[1];
              *plVar4 = (long)puVar8;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              NamedEntity::name_abi_cxx11_(&local_190,(NamedEntity *)local_318._16_8_);
              uVar12 = 0xf;
              if (local_230 != &local_220) {
                uVar12 = local_220;
              }
              if (uVar12 < local_190._M_string_length + local_228) {
                uVar13 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_190._M_dataplus._M_p != &local_190.field_2) {
                  uVar13 = local_190.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar13 < local_190._M_string_length + local_228) goto LAB_00286340;
                plVar4 = (long *)std::__cxx11::string::replace
                                           ((ulong)&local_190,0,(char *)0x0,(ulong)local_230);
              }
              else {
LAB_00286340:
                plVar4 = (long *)std::__cxx11::string::_M_append
                                           ((char *)&local_230,(ulong)local_190._M_dataplus._M_p);
              }
              local_2a8.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
              super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_288;
              peVar6 = (element_type *)(plVar4 + 2);
              if ((element_type *)*plVar4 == peVar6) {
                local_288.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
                     (peVar6->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
                local_288.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl =
                     (EntityImpl *)plVar4[3];
              }
              else {
                local_288.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
                     (peVar6->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
                local_2a8.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)*plVar4;
              }
              local_2a8.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
              super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar4[1];
              *plVar4 = (long)peVar6;
              plVar4[1] = 0;
              *(undefined1 *)
               &(peVar6->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity = 0;
              plVar4 = (long *)std::__cxx11::string::append
                                         ((char *)&local_2a8.
                                                                                                      
                                                  super_enable_shared_from_this<libcellml::Variable>
                                         );
              local_210 = &local_200;
              puVar8 = (ulong *)(plVar4 + 2);
              if ((ulong *)*plVar4 == puVar8) {
                local_200 = *puVar8;
                lStack_1f8 = plVar4[3];
              }
              else {
                local_200 = *puVar8;
                local_210 = (ulong *)*plVar4;
              }
              local_208 = plVar4[1];
              *plVar4 = (long)puVar8;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              NamedEntity::name_abi_cxx11_
                        (&local_1b0,
                         (NamedEntity *)
                         local_120.
                         super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
              uVar12 = 0xf;
              if (local_210 != &local_200) {
                uVar12 = local_200;
              }
              if (uVar12 < local_1b0._M_string_length + local_208) {
                uVar13 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                  uVar13 = local_1b0.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar13 < local_1b0._M_string_length + local_208) goto LAB_0028649c;
                plVar4 = (long *)std::__cxx11::string::replace
                                           ((ulong)&local_1b0,0,(char *)0x0,(ulong)local_210);
              }
              else {
LAB_0028649c:
                plVar4 = (long *)std::__cxx11::string::_M_append
                                           ((char *)&local_210,(ulong)local_1b0._M_dataplus._M_p);
              }
              local_288.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
              super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_268;
              peVar6 = (element_type *)(plVar4 + 2);
              if ((element_type *)*plVar4 == peVar6) {
                local_268.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
                     (peVar6->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
                local_268.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl =
                     (EntityImpl *)plVar4[3];
              }
              else {
                local_268.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
                     (peVar6->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
                local_288.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)*plVar4;
              }
              local_288.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
              super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar4[1];
              *plVar4 = (long)peVar6;
              plVar4[1] = 0;
              *(undefined1 *)
               &(peVar6->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity = 0;
              plVar4 = (long *)std::__cxx11::string::append
                                         ((char *)&local_288.
                                                                                                      
                                                  super_enable_shared_from_this<libcellml::Variable>
                                         );
              local_1f0 = &local_1e0;
              puVar8 = (ulong *)(plVar4 + 2);
              if ((ulong *)*plVar4 == puVar8) {
                local_1e0 = *puVar8;
                lStack_1d8 = plVar4[3];
              }
              else {
                local_1e0 = *puVar8;
                local_1f0 = (ulong *)*plVar4;
              }
              local_1e8 = plVar4[1];
              *plVar4 = (long)puVar8;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              Variable::units((Variable *)local_318._16_8_);
              NamedEntity::name_abi_cxx11_(&local_1d0,local_98);
              uVar12 = 0xf;
              if (local_1f0 != &local_1e0) {
                uVar12 = local_1e0;
              }
              if (uVar12 < local_1d0._M_string_length + local_1e8) {
                uVar13 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
                  uVar13 = local_1d0.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar13 < local_1d0._M_string_length + local_1e8) goto LAB_0028660a;
                plVar4 = (long *)std::__cxx11::string::replace
                                           ((ulong)&local_1d0,0,(char *)0x0,(ulong)local_1f0);
              }
              else {
LAB_0028660a:
                plVar4 = (long *)std::__cxx11::string::_M_append
                                           ((char *)&local_1f0,(ulong)local_1d0._M_dataplus._M_p);
              }
              local_348 = &local_338;
              peVar6 = (element_type *)(plVar4 + 2);
              if ((element_type *)*plVar4 == peVar6) {
                local_338.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
                     (peVar6->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
                local_338.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl =
                     (EntityImpl *)plVar4[3];
              }
              else {
                local_338.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
                     (peVar6->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
                local_348 = (element_type *)*plVar4;
              }
              p_Stack_340 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar4[1];
              *plVar4 = (long)peVar6;
              plVar4[1] = 0;
              *(undefined1 *)
               &(peVar6->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity = 0;
              plVar4 = (long *)std::__cxx11::string::append((char *)&local_348);
              local_338.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
              super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_318;
              peVar9 = (element_type *)(plVar4 + 2);
              if ((element_type *)*plVar4 == peVar9) {
                local_318._0_8_ =
                     (peVar9->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
                local_318._8_8_ = plVar4[3];
              }
              else {
                local_318._0_8_ =
                     (peVar9->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
                local_338.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)*plVar4;
              }
              local_338.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
              super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar4[1];
              *plVar4 = (long)peVar9;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              plVar4 = (long *)std::__cxx11::string::_M_append
                                         ((char *)&local_338.
                                                                                                      
                                                  super_enable_shared_from_this<libcellml::Variable>
                                          ,(ulong)local_d0._M_dataplus._M_p);
              local_368._0_8_ = local_368 + 0x10;
              peVar9 = (element_type *)(plVar4 + 2);
              if ((element_type *)*plVar4 == peVar9) {
                local_368._16_8_ =
                     (peVar9->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
                local_368._24_8_ = plVar4[3];
              }
              else {
                local_368._16_8_ =
                     (peVar9->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
                local_368._0_8_ = (element_type *)*plVar4;
              }
              local_368._8_8_ = plVar4[1];
              *plVar4 = (long)peVar9;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              Issue::IssueImpl::setDescription(local_b0,(string *)local_368);
              if ((element_type *)local_368._0_8_ != (element_type *)(local_368 + 0x10)) {
                operator_delete((void *)local_368._0_8_,(ulong)(local_368._16_8_ + 1));
              }
              if (local_338.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                  super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)local_318) {
                operator_delete(local_338.super_enable_shared_from_this<libcellml::Variable>.
                                _M_weak_this.
                                super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr,(ulong)((long)&(((NamedEntity *)local_318._0_8_)->
                                                      super_ParentedEntity).super_Entity.
                                                      _vptr_Entity + 1));
              }
              if (local_348 != &local_338) {
                operator_delete(local_348,
                                (ulong)((long)&(((NamedEntity *)
                                                local_338.super_NamedEntity.super_ParentedEntity.
                                                super_Entity._vptr_Entity)->super_ParentedEntity).
                                               super_Entity._vptr_Entity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
                operator_delete(local_1d0._M_dataplus._M_p,
                                local_1d0.field_2._M_allocated_capacity + 1);
              }
              if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
              }
              if (local_1f0 != &local_1e0) {
                operator_delete(local_1f0,local_1e0 + 1);
              }
              if (local_288.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                  super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  &local_268) {
                operator_delete(local_288.super_enable_shared_from_this<libcellml::Variable>.
                                _M_weak_this.
                                super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr,(long)local_268.super_NamedEntity.super_ParentedEntity.
                                             super_Entity._vptr_Entity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                operator_delete(local_1b0._M_dataplus._M_p,
                                local_1b0.field_2._M_allocated_capacity + 1);
              }
              if (local_210 != &local_200) {
                operator_delete(local_210,local_200 + 1);
              }
              if (local_2a8.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                  super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  &local_288) {
                operator_delete(local_2a8.super_enable_shared_from_this<libcellml::Variable>.
                                _M_weak_this.
                                super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr,(long)local_288.super_NamedEntity.super_ParentedEntity.
                                             super_Entity._vptr_Entity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_190._M_dataplus._M_p != &local_190.field_2) {
                operator_delete(local_190._M_dataplus._M_p,
                                local_190.field_2._M_allocated_capacity + 1);
              }
              if (local_230 != &local_220) {
                operator_delete(local_230,local_220 + 1);
              }
              if (local_2c8.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                  super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  &local_2a8) {
                operator_delete(local_2c8.super_enable_shared_from_this<libcellml::Variable>.
                                _M_weak_this.
                                super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr,(long)local_2a8.super_NamedEntity.super_ParentedEntity.
                                             super_Entity._vptr_Entity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_170._M_dataplus._M_p != &local_170.field_2) {
                operator_delete(local_170._M_dataplus._M_p,
                                local_170.field_2._M_allocated_capacity + 1);
              }
              if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
              }
              if (local_268.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                  super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi != &local_240) {
                operator_delete(local_268.super_enable_shared_from_this<libcellml::Variable>.
                                _M_weak_this.
                                super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi,(long)local_240._vptr__Sp_counted_base + 1);
              }
              if (local_2e8.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
                  super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  &local_2c8) {
                operator_delete(local_2e8.super_enable_shared_from_this<libcellml::Variable>.
                                _M_weak_this.
                                super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr,(long)local_2c8.super_NamedEntity.super_ParentedEntity.
                                             super_Entity._vptr_Entity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_150._M_dataplus._M_p != &local_150.field_2) {
                operator_delete(local_150._M_dataplus._M_p,
                                local_150.field_2._M_allocated_capacity + 1);
              }
              if (local_2f8 != &local_2e8) {
                operator_delete(local_2f8,
                                (long)local_2e8.super_NamedEntity.super_ParentedEntity.super_Entity.
                                      _vptr_Entity + 1);
              }
              if (local_110 != &local_100) {
                operator_delete(local_110,local_100 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_dataplus._M_p != &local_60.field_2) {
                operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1
                               );
              }
              AnyCellmlElement::AnyCellmlElementImpl::setMapVariables
                        ((((local_130.
                            super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->mPimpl->mItem).
                          super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->mPimpl,variable,(VariablePtr *)(local_318 + 0x10));
              Issue::IssueImpl::setReferenceRule
                        ((local_130.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->mPimpl,MAP_VARIABLES_ELEMENT);
              Logger::LoggerImpl::addIssue(&local_a8->super_LoggerImpl,&local_130);
              if (local_130.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_130.
                           super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if (local_40.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_40.
                           super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
            }
          }
        }
      }
      if (local_120.super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_120.
                   super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_300._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_300._M_pi);
      }
      uVar14 = uVar14 + 1;
    }
  }
  if (local_70.super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.
               super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                             local_d0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void Validator::ValidatorImpl::validateEquivalenceUnits(const ModelPtr &model, const VariablePtr &variable, VariableMap &alreadyReported)
{
    std::string hints;
    ComponentPtr parentComponent = owningComponent(variable);

    if (variable->units() == nullptr) {
        // If the variable has no units, don't check it.
        return;
    }

    for (size_t index = 0; index < variable->equivalentVariableCount(); ++index) {
        auto equivalentVariable = variable->equivalentVariable(index);

        // If the parent component of the variable is nonexistent or imported, don't check it.
        auto equivalentComponent = owningComponent(equivalentVariable);
        if ((equivalentComponent == nullptr) || equivalentComponent->isImport()) {
            continue;
        }

        // If the equivalent variable has no units, don't check it.
        if (equivalentVariable->units() == nullptr) {
            continue;
        }

        double multiplier = 0.0;
        if (!unitsAreEquivalent(model, variable, equivalentVariable, hints, multiplier)) {
            auto it = std::find_if(alreadyReported.begin(), alreadyReported.end(),
                                   [equivalentVariable, variable](const VariablePairPtr &in) {
                                       return (in->variable1() == equivalentVariable) && (in->variable2() == variable);
                                   });
            if (it == alreadyReported.end()) {
                VariablePairPtr pair = VariablePair::create(variable, equivalentVariable);
                alreadyReported.push_back(pair);
                IssuePtr err = Issue::IssueImpl::create();
                err->mPimpl->setDescription("Variable '" + variable->name() + "' in component '" + parentComponent->name() + "' has units of '" + variable->units()->name() + "' and an equivalent variable '" + equivalentVariable->name() + "' in component '" + equivalentComponent->name() + "' with non-matching units of '" + equivalentVariable->units()->name() + "'. The mismatch is: " + hints);
                err->mPimpl->mItem->mPimpl->setMapVariables(variable, equivalentVariable);
                err->mPimpl->setReferenceRule(Issue::ReferenceRule::MAP_VARIABLES_ELEMENT);
                addIssue(err);
            }
        }
    }
}